

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absRpm.c
# Opt level: O0

void Gia_ManTestDoms(Gia_Man_t *p)

{
  int iVar1;
  Vec_Int_t *p_00;
  bool bVar2;
  int local_24;
  Gia_Obj_t *pGStack_20;
  int i;
  Gia_Obj_t *pObj;
  Vec_Int_t *vNodes;
  Gia_Man_t *p_local;
  
  Gia_ManCleanMark1(p);
  local_24 = 0;
  while( true ) {
    iVar1 = Gia_ManPiNum(p);
    bVar2 = false;
    if (local_24 < iVar1) {
      pGStack_20 = Gia_ManCi(p,local_24);
      bVar2 = pGStack_20 != (Gia_Obj_t *)0x0;
    }
    if (!bVar2) break;
    *(ulong *)pGStack_20 = *(ulong *)pGStack_20 & 0xbfffffffffffffff | 0x4000000000000000;
    local_24 = local_24 + 1;
  }
  if (p->vDoms == (Vec_Int_t *)0x0) {
    p_00 = Gia_ManComputePiDoms(p);
    Vec_IntFree(p_00);
    Gia_ManCleanMark1(p);
    return;
  }
  __assert_fail("p->vDoms == NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absRpm.c"
                ,0x127,"void Gia_ManTestDoms(Gia_Man_t *)");
}

Assistant:

void Gia_ManTestDoms( Gia_Man_t * p )
{
    Vec_Int_t * vNodes;
    Gia_Obj_t * pObj;
    int i;
    // mark PIs
//    Gia_ManCreateRefs( p );
    Gia_ManCleanMark1( p );
    Gia_ManForEachPi( p, pObj, i )
        pObj->fMark1 = 1;
    // compute dominators
    assert( p->vDoms == NULL );
    vNodes = Gia_ManComputePiDoms( p );
//    printf( "Nodes = %d. Doms = %d.\n", Gia_ManAndNum(p), Vec_IntSize(vNodes) );
    Vec_IntFree( vNodes );
    // unmark PIs
    Gia_ManCleanMark1( p );
}